

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O3

void __thiscall
QPixmapStyle::drawPrimitive
          (QPixmapStyle *this,PrimitiveElement element,QStyleOption *option,QPainter *painter,
          QWidget *widget)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  ControlDescriptor control;
  ControlDescriptor CVar4;
  
  if (0x11 < (int)element) {
    if ((int)element < 0x1f) {
      if (element == PE_PanelLineEdit) goto switchD_0034263c_caseD_5;
      if (element == PE_IndicatorCheckBox) {
        drawCheckBox(this,option,painter,(QWidget *)painter);
        return;
      }
    }
    else {
      if (element == PE_IndicatorRadioButton) {
        drawRadioButton(this,option,painter,(QWidget *)painter);
        return;
      }
      if (element == PE_PanelItemViewItem) {
        lVar2 = QMetaObject::cast((QObject *)&QListView::staticMetaObject);
        if (lVar2 != 0) {
          drawPanelItemViewItem(this,option,painter,widget);
          return;
        }
        element = PE_PanelItemViewItem;
        goto LAB_0034277b;
      }
    }
switchD_0034263c_caseD_2:
LAB_0034277b:
    QCommonStyle::drawPrimitive(&this->super_QCommonStyle,element,option,painter,widget);
    return;
  }
  switch(element) {
  case PE_Frame:
  case PE_FrameDefaultButton:
    lVar2 = QMetaObject::cast((QObject *)&QTextEdit::staticMetaObject);
    if (lVar2 == 0) {
      return;
    }
    uVar1 = (option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
            super_QFlagsStorage<QStyle::StateFlag>.i;
    control = TE_Disabled;
    if ((uVar1 & 1) != 0) {
      control = uVar1 >> 7 & LE_Disabled | TE_Enabled;
    }
    break;
  default:
    goto switchD_0034263c_caseD_2;
  case PE_FrameFocusRect:
    return;
  case PE_FrameLineEdit:
switchD_0034263c_caseD_5:
    drawLineEdit(this,option,painter,widget);
    return;
  case PE_PanelButtonCommand:
  case PE_PanelButtonBevel:
    uVar1 = (option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
            super_QFlagsStorage<QStyle::StateFlag>.i;
    uVar3 = uVar1 & 0x20;
    CVar4 = PB_Pressed;
    if ((uVar1 & 4) == 0) {
      CVar4 = (uVar3 >> 5) * 3 + PB_Enabled;
    }
    control = (uVar3 == 0) + 6 + (uint)(uVar3 == 0);
    if ((uVar1 & 1) != 0) {
      control = CVar4;
    }
  }
  drawCachedPixmap(this,control,&option->rect,painter);
  return;
}

Assistant:

void QPixmapStyle::drawPrimitive(PrimitiveElement element, const QStyleOption *option,
                                 QPainter *painter, const QWidget *widget) const
{
    switch (element) {
    case PE_FrameFocusRect: //disable focus rectangle
        break;
    case PE_PanelButtonBevel:
    case PE_PanelButtonCommand:
        drawPushButton(option, painter, widget);
        break;
    case PE_PanelLineEdit:
    case PE_FrameLineEdit:
        drawLineEdit(option, painter, widget);
        break;
    case PE_Frame:
#if QT_CONFIG(textedit)
    case PE_FrameDefaultButton:
        if (qobject_cast<const QTextEdit*>(widget))
            drawTextEdit(option, painter, widget);
        break;
#endif
    case PE_IndicatorCheckBox:
        drawCheckBox(option, painter, widget);
        break;
    case PE_IndicatorRadioButton:
        drawRadioButton(option, painter, widget);
        break;
    case PE_PanelItemViewItem:
#if QT_CONFIG(listview)
        if (qobject_cast<const QListView*>(widget))
            drawPanelItemViewItem(option, painter, widget);
        else
#endif
            QCommonStyle::drawPrimitive(element, option, painter, widget);
        break;
    default:
        QCommonStyle::drawPrimitive(element, option, painter, widget);
    }
}